

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

jx9_stream_data * JX9StreamDataInit(jx9_vm *pVm,int iType)

{
  int local_2c;
  int ifd;
  jx9_stream_data *pData;
  int iType_local;
  jx9_vm *pVm_local;
  
  if (pVm == (jx9_vm *)0x0) {
    pVm_local = (jx9_vm *)0x0;
  }
  else {
    pVm_local = (jx9_vm *)SyMemBackendAlloc(&pVm->sAllocator,0x30);
    if (pVm_local == (jx9_vm *)0x0) {
      pVm_local = (jx9_vm *)0x0;
    }
    else {
      SyZero(pVm_local,0x30);
      *(int *)&(pVm_local->sAllocator).pMethods = iType;
      if (iType == 4) {
        (pVm_local->sAllocator).pBlocks = (SyMemBlock *)(pVm->sVmConsumer).xConsumer;
        *(void **)&(pVm_local->sAllocator).nBlock = (pVm->sVmConsumer).pUserData;
        (pVm_local->sAllocator).xMemError = (ProcMemError)(pVm->sVmConsumer).xDef;
        (pVm_local->sAllocator).pUserData = (pVm->sVmConsumer).pDefData;
      }
      else {
        local_2c = 0;
        if (iType == 2) {
          local_2c = 1;
        }
        else if (iType == 3) {
          local_2c = 2;
        }
        (pVm_local->sAllocator).pBlocks = (SyMemBlock *)(long)local_2c;
      }
      (pVm_local->sAllocator).pMutexMethods = (SyMutexMethods *)pVm;
    }
  }
  return (jx9_stream_data *)pVm_local;
}

Assistant:

static jx9_stream_data * JX9StreamDataInit(jx9_vm *pVm, int iType)
{
	jx9_stream_data *pData;
	if( pVm == 0 ){
		return 0;
	}
	/* Allocate a new instance */
	pData = (jx9_stream_data *)SyMemBackendAlloc(&pVm->sAllocator, sizeof(jx9_stream_data));
	if( pData == 0 ){
		return 0;
	}
	/* Zero the structure */
	SyZero(pData, sizeof(jx9_stream_data));
	/* Initialize fields */
	pData->iType = iType;
	if( iType == JX9_IO_STREAM_OUTPUT ){
		/* Point to the default VM consumer routine. */
		pData->x.sConsumer = pVm->sVmConsumer; 
	}else{
#ifdef __WINNT__
		DWORD nChannel;
		switch(iType){
		case JX9_IO_STREAM_STDOUT:	nChannel = STD_OUTPUT_HANDLE; break;
		case JX9_IO_STREAM_STDERR:  nChannel = STD_ERROR_HANDLE; break;
		default:
			nChannel = STD_INPUT_HANDLE; 
			break;
		}
		pData->x.pHandle = GetStdHandle(nChannel);
#else
		/* Assume an UNIX system */
		int ifd = STDIN_FILENO;
		switch(iType){
		case JX9_IO_STREAM_STDOUT:  ifd = STDOUT_FILENO; break;
		case JX9_IO_STREAM_STDERR:  ifd = STDERR_FILENO; break;
		default:
			break;
		}
		pData->x.pHandle = SX_INT_TO_PTR(ifd);
#endif
	}
	pData->pVm = pVm;
	return pData;
}